

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.cpp
# Opt level: O0

void pbrt::InitBufferCaches(Allocator alloc)

{
  polymorphic_allocator<std::byte> *in_stack_00000008;
  polymorphic_allocator<std::byte> *in_stack_00000010;
  char (*in_stack_00000040) [26];
  char *in_stack_00000048;
  int in_stack_00000054;
  char *in_stack_00000058;
  LogLevel in_stack_00000064;
  
  if (intBufferCache != (BufferCache<int> *)0x0) {
    LogFatal<char_const(&)[26]>
              (in_stack_00000064,in_stack_00000058,in_stack_00000054,in_stack_00000048,
               in_stack_00000040);
  }
  intBufferCache =
       pstd::pmr::polymorphic_allocator<std::byte>::
       new_object<pbrt::BufferCache<int>,pstd::pmr::polymorphic_allocator<std::byte>&>
                 (in_stack_00000010,in_stack_00000008);
  point2BufferCache =
       pstd::pmr::polymorphic_allocator<std::byte>::
       new_object<pbrt::BufferCache<pbrt::Point2<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                 (in_stack_00000010,in_stack_00000008);
  point3BufferCache =
       pstd::pmr::polymorphic_allocator<std::byte>::
       new_object<pbrt::BufferCache<pbrt::Point3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                 (in_stack_00000010,in_stack_00000008);
  vector3BufferCache =
       pstd::pmr::polymorphic_allocator<std::byte>::
       new_object<pbrt::BufferCache<pbrt::Vector3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                 (in_stack_00000010,in_stack_00000008);
  normal3BufferCache =
       pstd::pmr::polymorphic_allocator<std::byte>::
       new_object<pbrt::BufferCache<pbrt::Normal3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                 (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void InitBufferCaches(Allocator alloc) {
    CHECK(intBufferCache == nullptr);
    intBufferCache = alloc.new_object<BufferCache<int>>(alloc);
    point2BufferCache = alloc.new_object<BufferCache<Point2f>>(alloc);
    point3BufferCache = alloc.new_object<BufferCache<Point3f>>(alloc);
    vector3BufferCache = alloc.new_object<BufferCache<Vector3f>>(alloc);
    normal3BufferCache = alloc.new_object<BufferCache<Normal3f>>(alloc);
}